

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_pos_bucket::set_input(llm_graph_input_pos_bucket *this,llama_ubatch *ubatch)

{
  long lVar1;
  int32_t iVar2;
  ulong uVar3;
  ulong uVar4;
  byte *in_RSI;
  long in_RDI;
  int i;
  int j;
  int h;
  int32_t *data;
  int64_t n_tokens;
  int local_2c;
  int local_28;
  int local_24;
  
  if (*(long *)(in_RDI + 8) != 0) {
    uVar4 = (ulong)*(uint *)(in_RSI + 4);
    uVar3 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    if ((uVar3 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x52,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(pos_bucket->buffer)");
    }
    if ((*in_RSI & 1) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x53,"GGML_ASSERT(%s) failed","!ubatch->equal_seqs");
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    for (local_24 = 0; local_24 < 1; local_24 = local_24 + 1) {
      for (local_28 = 0; (long)local_28 < (long)uVar4; local_28 = local_28 + 1) {
        for (local_2c = 0; (long)local_2c < (long)uVar4; local_2c = local_2c + 1) {
          iVar2 = llama_relative_position_bucket
                            (n_tokens._4_4_,(llama_pos)n_tokens,(uint64_t)data,h._3_1_);
          *(int32_t *)
           (lVar1 + ((long)local_24 * uVar4 * uVar4 + (long)local_28 * uVar4 + (long)local_2c) * 4)
               = iVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_pos_bucket::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[h*(n_tokens*n_tokens) + j*n_tokens + i] = llama_relative_position_bucket(ubatch->pos[i], ubatch->pos[j], hparams.n_rel_attn_bkts, true);
                }
            }
        }
    }
}